

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O3

char * uo_json_find_value(char *json,char *name)

{
  ushort *puVar1;
  int iVar2;
  size_t __n;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  __n = strlen(name);
  ppuVar3 = __ctype_b_loc();
  puVar1 = *ppuVar3;
  pcVar5 = json + -1;
  do {
    pcVar4 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while ((*(byte *)((long)puVar1 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
  if (*pcVar4 == '{') {
    while ((((*pcVar5 != '\0' && (pcVar4 = strchr(pcVar5,0x7d), pcVar4 != (char *)0x0)) &&
            (pcVar5 = strchr(pcVar5,0x22), pcVar5 != (char *)0x0)) &&
           ((pcVar5 <= pcVar4 && (pcVar4 = uo_json_find_str_end(pcVar5), pcVar4 != (char *)0x0)))))
    {
      if (__n + 2 == (long)pcVar4 - (long)pcVar5) {
        iVar2 = bcmp(name,pcVar5 + 1,__n);
        bVar6 = iVar2 == 0;
      }
      else {
        bVar6 = false;
      }
      pcVar5 = strchr(pcVar4,0x3a);
      if (pcVar5 == (char *)0x0) {
        return (char *)0x0;
      }
      do {
        pcVar4 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while ((*(byte *)((long)puVar1 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
      if (bVar6) {
        return pcVar5;
      }
      pcVar5 = uo_json_find_end(pcVar5);
      if (pcVar5 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar4 = strchr(pcVar5 + 1,0x7d);
      if (pcVar4 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar5 = strchr(pcVar5,0x2c);
      if (pcVar5 == (char *)0x0) {
        return (char *)0x0;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *uo_json_find_value(
    const char *json,
    const char *name)
{
    size_t name_len = strlen(name);

    const char *p = json;

    while (isspace(*p))
        ++p;

    if (*p != '{')
        return NULL;

    while (*p)
    {
        const char *right_brace = strchr(p, '}');
        if (!right_brace)
            return NULL;

        const char *key = strchr(p, '\"');
        if (!key || right_brace < key)
            return NULL;

        const char *key_end = uo_json_find_str_end(key);
        if (!key_end)
            return NULL;

        bool is_match = name_len + 2 == key_end - key
            && memcmp(name, key + 1, name_len) == 0;

        p = strchr(key_end, ':');
        if (!p)
            return NULL;

        ++p;

        while (isspace(*p))
            ++p;

        if (is_match)
            return (char *)p;

        p = uo_json_find_end(p);
        if (!p)
            return NULL;

        right_brace = strchr(p + 1, '}');
        if (!right_brace)
            return NULL;

        p = strchr(p, ',');
        if (!p)
            return NULL;
    }

    return NULL;
}